

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint lodepng_deflate(uchar **out,size_t *outsize,uchar *in,size_t insize,
                    LodePNGCompressSettings *settings)

{
  long lVar1;
  int iVar2;
  size_t __size;
  uint *puVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  size_t i;
  int *__ptr;
  int *__ptr_00;
  unsigned_short *__ptr_01;
  long lVar7;
  ulong uVar8;
  uint *puVar9;
  uint *puVar10;
  uint *frequencies;
  long lVar11;
  void *__ptr_02;
  void *__ptr_03;
  ulong uVar12;
  ulong uVar13;
  size_t sVar14;
  uchar *puVar15;
  long lVar16;
  int *piVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  uint *puVar21;
  long lVar22;
  bool bVar23;
  LodePNGBitWriter local_1e8;
  LodePNGCompressSettings *local_1d8;
  uchar *local_1d0;
  size_t local_1c8;
  ulong local_1c0;
  uint *local_1b8;
  uint *local_1b0;
  uchar **local_1a8;
  size_t *local_1a0;
  ulong local_198;
  unsigned_short *local_190;
  int *local_188;
  ulong local_180;
  unsigned_short *local_178;
  ucvector v;
  HuffmanTree tree_ll;
  uivector lz77_encoded;
  HuffmanTree tree_d;
  HuffmanTree local_88;
  Hash hash;
  
  v.data = *out;
  v.size = *outsize;
  local_1e8.data = &v;
  local_1e8.bp = '\0';
  uVar5 = settings->btype;
  if (uVar5 < 3) {
    local_198 = insize;
    local_1c8 = insize;
    local_1a8 = out;
    local_1a0 = outsize;
    v.allocsize = v.size;
    if (uVar5 != 1) {
      if (uVar5 == 0) {
        uVar13 = 0;
        uVar18 = (insize + 0xfffe) / 0xffff;
        while (sVar14 = v.size, uVar18 != 0) {
          uVar5 = (int)local_1c8 - (int)uVar13;
          if (0xfffe < local_1c8 - uVar13) {
            uVar5 = 0xffff;
          }
          uVar4 = ucvector_resize(&v,uVar5 + v.size + 5);
          if (uVar4 == 0) {
            uVar5 = 0x53;
            outsize = local_1a0;
            out = local_1a8;
            goto LAB_0012546a;
          }
          v.data[sVar14] = uVar18 == 1;
          v.data[sVar14 + 1] = (uchar)uVar5;
          v.data[sVar14 + 2] = (uchar)(uVar5 >> 8);
          v.data[sVar14 + 3] = (uchar)(0xffff - uVar5);
          v.data[sVar14 + 4] = (uchar)(0xffff - uVar5 >> 8);
          lodepng_memcpy(v.data + sVar14 + 5,in + uVar13,(ulong)uVar5);
          uVar13 = (ulong)((int)uVar13 + uVar5);
          uVar18 = uVar18 - 1;
        }
        uVar5 = 0;
        outsize = local_1a0;
        out = local_1a8;
        goto LAB_0012546a;
      }
      uVar18 = 0xfff8;
      if (0xfff8 < insize >> 3) {
        uVar18 = insize >> 3;
      }
      if (0x3fff7 < uVar18) {
        uVar18 = 0x3fff8;
      }
      local_198 = uVar18 + 8;
    }
    uVar18 = 1;
    if (!CARRY8(insize - 1,local_198)) {
      uVar18 = ((insize - 1) + local_198) / local_198;
    }
    uVar13 = (ulong)settings->windowsize;
    __ptr = (int *)malloc(0x40000);
    hash.head = __ptr;
    __ptr_00 = (int *)malloc(uVar13 * 4);
    __size = uVar13 * 2;
    hash.val = __ptr_00;
    local_178 = (unsigned_short *)malloc(__size);
    hash.chain = local_178;
    __ptr_01 = (unsigned_short *)malloc(__size);
    hash.zeros = __ptr_01;
    local_188 = (int *)malloc(0x40c);
    hash.headz = local_188;
    local_190 = (unsigned_short *)malloc(__size);
    uVar5 = 0x53;
    hash.chainz = local_190;
    if (((((__ptr_00 != (int *)0x0) && (__ptr != (int *)0x0)) &&
         (local_178 != (unsigned_short *)0x0)) &&
        ((__ptr_01 != (unsigned_short *)0x0 && (local_188 != (int *)0x0)))) &&
       (local_190 != (unsigned_short *)0x0)) {
      for (lVar7 = 0; lVar7 != 0x10000; lVar7 = lVar7 + 1) {
        __ptr[lVar7] = -1;
      }
      for (uVar8 = 0; uVar13 != uVar8; uVar8 = uVar8 + 1) {
        __ptr_00[uVar8] = -1;
      }
      for (uVar8 = 0; uVar13 != uVar8; uVar8 = uVar8 + 1) {
        local_178[uVar8] = (unsigned_short)uVar8;
      }
      for (lVar7 = 0; lVar7 != 0x103; lVar7 = lVar7 + 1) {
        local_188[lVar7] = -1;
      }
      for (uVar8 = 0; uVar13 != uVar8; uVar8 = uVar8 + 1) {
        local_190[uVar8] = (unsigned_short)uVar8;
      }
      lVar7 = 0;
      uVar8 = 0;
      uVar5 = 0;
      uVar13 = local_198;
      puVar15 = in;
      uVar19 = local_1c8;
      local_1d8 = settings;
      while ((uVar8 != uVar18 && (uVar5 == 0))) {
        uVar20 = uVar8 * uVar13;
        uVar12 = uVar20 + uVar13;
        if (uVar19 <= uVar20 + uVar13) {
          uVar12 = uVar19;
        }
        uVar4 = (uint)(uVar8 == uVar18 - 1);
        if (settings->btype == 2) {
          local_1b0 = (uint *)CONCAT44(local_1b0._4_4_,uVar4);
          lz77_encoded.allocsize = 0;
          lz77_encoded.data = (uint *)0x0;
          lz77_encoded.size = 0;
          tree_ll.codes = (uint *)0x0;
          tree_ll.lengths = (uint *)0x0;
          tree_ll.table_len = (uchar *)0x0;
          tree_ll.table_value = (unsigned_short *)0x0;
          tree_d.codes = (uint *)0x0;
          tree_d.lengths = (uint *)0x0;
          tree_d.table_len = (uchar *)0x0;
          tree_d.table_value = (unsigned_short *)0x0;
          local_88.codes = (uint *)0x0;
          local_88.lengths = (uint *)0x0;
          local_88.table_len = (uchar *)0x0;
          local_88.table_value = (unsigned_short *)0x0;
          local_1d0 = puVar15;
          local_180 = uVar8;
          puVar9 = (uint *)malloc(0x478);
          puVar10 = (uint *)malloc(0x78);
          frequencies = (uint *)malloc(0x4c);
          if (frequencies == (uint *)0x0 || (puVar10 == (uint *)0x0 || puVar9 == (uint *)0x0)) {
LAB_00124d7e:
            __ptr_03 = (void *)0x0;
            __ptr_02 = (void *)0x0;
            uVar5 = 0x53;
          }
          else {
            for (lVar11 = 0; lVar11 != 0x478; lVar11 = lVar11 + 1) {
              *(undefined1 *)((long)puVar9 + lVar11) = 0;
            }
            for (lVar11 = 0; lVar11 != 0x78; lVar11 = lVar11 + 1) {
              *(undefined1 *)((long)puVar10 + lVar11) = 0;
            }
            for (lVar11 = 0; lVar11 != 0x4c; lVar11 = lVar11 + 1) {
              *(undefined1 *)((long)frequencies + lVar11) = 0;
            }
            if (local_1d8->use_lz77 == 0) {
              uVar5 = uivector_resize(&lz77_encoded,uVar12 - uVar20);
              if (uVar5 == 0) goto LAB_00124d7e;
              for (lVar11 = 0; (ulong)(lVar7 + lVar11) < uVar12; lVar11 = lVar11 + 1) {
                lz77_encoded.data[lVar11] = (uint)local_1d0[lVar11];
              }
            }
            else {
              uVar5 = encodeLZ77(&lz77_encoded,&hash,in,uVar20,uVar12,local_1d8->windowsize,
                                 local_1d8->minmatch,local_1d8->nicematch,local_1d8->lazymatching);
              if (uVar5 != 0) {
                __ptr_03 = (void *)0x0;
                __ptr_02 = (void *)0x0;
                goto LAB_00124ed8;
              }
            }
            for (sVar14 = 0; sVar14 != lz77_encoded.size; sVar14 = sVar14 + 1) {
              uVar5 = lz77_encoded.data[sVar14];
              puVar9[uVar5] = puVar9[uVar5] + 1;
              if (0x100 < (ulong)uVar5) {
                puVar10[lz77_encoded.data[sVar14 + 2]] = puVar10[lz77_encoded.data[sVar14 + 2]] + 1;
                sVar14 = sVar14 + 3;
              }
            }
            puVar9[0x100] = 1;
            uVar5 = HuffmanTree_makeFromFrequencies(&tree_ll,puVar9,0x101,0x11e,0xf);
            if ((uVar5 == 0) &&
               (uVar5 = HuffmanTree_makeFromFrequencies(&tree_d,puVar10,2,0x1e,0xf), uVar5 == 0)) {
              uVar4 = tree_ll.numcodes;
              if (0x11d < tree_ll.numcodes) {
                uVar4 = 0x11e;
              }
              uVar8 = (ulong)uVar4;
              uVar13 = (ulong)tree_d.numcodes;
              if (0x1d < tree_d.numcodes) {
                uVar13 = 0x1e;
              }
              uVar19 = uVar13 + uVar8;
              uVar12 = (ulong)(uint)((int)uVar19 * 4);
              __ptr_02 = malloc(uVar12);
              __ptr_03 = malloc(uVar12);
              puVar3 = tree_ll.lengths;
              if (__ptr_03 == (void *)0x0 || __ptr_02 == (void *)0x0) {
                uVar5 = 0x53;
              }
              else {
                for (uVar12 = 0; uVar8 != uVar12; uVar12 = uVar12 + 1) {
                  *(uint *)((long)__ptr_02 + uVar12 * 4) = tree_ll.lengths[uVar12];
                }
                for (uVar12 = 0; uVar13 != uVar12; uVar12 = uVar12 + 1) {
                  *(uint *)((long)__ptr_02 + uVar12 * 4 + uVar8 * 4) = tree_d.lengths[uVar12];
                }
                lVar11 = 0;
                for (uVar8 = 0; uVar8 != uVar19; uVar8 = uVar8 + 1) {
                  iVar2 = *(int *)((long)__ptr_02 + uVar8 * 4);
                  uVar5 = 0;
                  while( true ) {
                    uVar20 = (ulong)uVar5;
                    uVar12 = uVar8 + 1 + uVar20;
                    if ((uVar19 <= uVar12) || (*(int *)((long)__ptr_02 + uVar12 * 4) != iVar2))
                    break;
                    uVar5 = uVar5 + 1;
                  }
                  if ((iVar2 == 0) && (1 < uVar5)) {
                    uVar6 = uVar5 + 1;
                    if (uVar6 < 0xb) {
                      *(undefined4 *)((long)__ptr_03 + lVar11 * 4) = 0x11;
                      *(uint *)((long)__ptr_03 + lVar11 * 4 + 4) = uVar5 - 2;
                    }
                    else {
                      if (0x89 < uVar6) {
                        uVar6 = 0x8a;
                      }
                      *(undefined4 *)((long)__ptr_03 + lVar11 * 4) = 0x12;
                      *(uint *)((long)__ptr_03 + lVar11 * 4 + 4) = uVar6 - 0xb;
                      uVar20 = (ulong)(uVar6 - 1);
                    }
                    lVar11 = lVar11 + 2;
LAB_001251e4:
                    uVar8 = uVar8 + uVar20;
                  }
                  else {
                    if (2 < uVar5) {
                      *(int *)((long)__ptr_03 + lVar11 * 4) = iVar2;
                      piVar17 = (int *)((long)__ptr_03 + lVar11 * 4 + 8);
                      for (lVar16 = 0; (ulong)((uVar5 / 6) * 2) + lVar16 != 0; lVar16 = lVar16 + -2)
                      {
                        piVar17[-1] = 0x10;
                        piVar17[0] = 3;
                        piVar17 = piVar17 + 2;
                      }
                      if (uVar5 % 6 < 3) {
                        lVar11 = (lVar11 - lVar16) + 1;
                        uVar20 = (ulong)(uVar5 - uVar5 % 6);
                      }
                      else {
                        piVar17[-1] = 0x10;
                        lVar11 = (lVar11 - lVar16) + 3;
                        *piVar17 = uVar5 % 6 - 3;
                      }
                      goto LAB_001251e4;
                    }
                    *(int *)((long)__ptr_03 + lVar11 * 4) = iVar2;
                    lVar11 = lVar11 + 1;
                  }
                }
                for (lVar16 = 0; lVar16 != lVar11; lVar16 = (lVar16 - (ulong)(uVar8 < 0x10)) + 2) {
                  uVar8 = (ulong)*(uint *)((long)__ptr_03 + lVar16 * 4);
                  frequencies[uVar8] = frequencies[uVar8] + 1;
                }
                uVar5 = HuffmanTree_makeFromFrequencies(&local_88,frequencies,0x13,0x13,7);
                if (uVar5 == 0) {
                  local_1b8 = local_88.lengths;
                  uVar8 = 0x14;
                  lVar16 = 0x13;
                  do {
                    lVar22 = lVar16;
                    local_1c0 = uVar8 - 1;
                    if (local_1c0 < 5) {
                      local_1c0 = 4;
                      break;
                    }
                    lVar1 = uVar8 * 4;
                    uVar8 = local_1c0;
                    lVar16 = lVar22 + -1;
                  } while (local_88.lengths[*(uint *)(&UNK_001d0e28 + lVar1)] == 0);
                  writeBits(&local_1e8,(uint)local_1b0,1);
                  writeBits(&local_1e8,0,1);
                  writeBits(&local_1e8,1,1);
                  local_1c0 = (ulong)((int)local_1c0 - 4);
                  writeBits(&local_1e8,uVar4 - 0x101,5);
                  writeBits(&local_1e8,(int)uVar13 - 1,5);
                  writeBits(&local_1e8,(uint)local_1c0,4);
                  puVar21 = CLCL_ORDER;
                  while (bVar23 = lVar22 != 0, lVar22 = lVar22 + -1, bVar23) {
                    writeBits(&local_1e8,local_1b8[*puVar21],3);
                    puVar21 = puVar21 + 1;
                  }
                  local_1b0 = local_88.codes;
                  for (lVar16 = 0; lVar16 != lVar11; lVar16 = lVar16 + 1) {
                    uVar5 = *(uint *)((long)__ptr_03 + lVar16 * 4);
                    writeBitsReversed(&local_1e8,local_1b0[uVar5],(ulong)local_1b8[uVar5]);
                    if (uVar5 - 0x10 < 3) {
                      lVar22 = lVar16 * 4;
                      lVar16 = lVar16 + 1;
                      writeBits(&local_1e8,*(uint *)((long)__ptr_03 + lVar22 + 4),
                                *(size_t *)(&DAT_001d0f00 + (ulong)(uVar5 - 0x10) * 8));
                    }
                  }
                  writeLZ77data(&local_1e8,&lz77_encoded,&tree_ll,&tree_d);
                  if ((ulong)puVar3[0x100] == 0) {
                    uVar5 = 0x40;
                  }
                  else {
                    writeBitsReversed(&local_1e8,tree_ll.codes[0x100],(ulong)puVar3[0x100]);
                    uVar5 = 0;
                  }
                }
              }
            }
            else {
              __ptr_03 = (void *)0x0;
              __ptr_02 = (void *)0x0;
            }
          }
LAB_00124ed8:
          uivector_cleanup(&lz77_encoded);
          HuffmanTree_cleanup(&tree_ll);
          HuffmanTree_cleanup(&tree_d);
          HuffmanTree_cleanup(&local_88);
          free(puVar9);
          free(puVar10);
          free(frequencies);
          free(__ptr_02);
          free(__ptr_03);
          uVar13 = local_198;
          puVar15 = local_1d0;
          uVar8 = local_180;
          settings = local_1d8;
          uVar19 = local_1c8;
        }
        else {
          uVar5 = 0;
          if (settings->btype == 1) {
            tree_ll.codes = (uint *)0x0;
            tree_ll.lengths = (uint *)0x0;
            tree_ll.table_len = (uchar *)0x0;
            tree_ll.table_value = (unsigned_short *)0x0;
            tree_d.codes = (uint *)0x0;
            tree_d.lengths = (uint *)0x0;
            tree_d.table_len = (uchar *)0x0;
            tree_d.table_value = (unsigned_short *)0x0;
            local_1d0 = puVar15;
            local_180 = uVar8;
            uVar5 = generateFixedLitLenTree(&tree_ll);
            if ((uVar5 == 0) && (uVar5 = generateFixedDistanceTree(&tree_d), uVar5 == 0)) {
              writeBits(&local_1e8,uVar4,1);
              writeBits(&local_1e8,1,1);
              writeBits(&local_1e8,0,1);
              puVar10 = tree_ll.lengths;
              puVar9 = tree_ll.codes;
              if (local_1d8->use_lz77 == 0) {
                for (; uVar20 < uVar12; uVar20 = uVar20 + 1) {
                  writeBitsReversed(&local_1e8,puVar9[in[uVar20]],(ulong)puVar10[in[uVar20]]);
                }
              }
              else {
                local_88.codes = (uint *)0x0;
                local_88.lengths = (uint *)0x0;
                local_88.maxbitlen = 0;
                local_88.numcodes = 0;
                uVar5 = encodeLZ77((uivector *)&local_88,&hash,in,uVar20,uVar12,
                                   local_1d8->windowsize,local_1d8->minmatch,local_1d8->nicematch,
                                   local_1d8->lazymatching);
                if (uVar5 != 0) {
                  uivector_cleanup(&local_88);
                  goto LAB_00124bb9;
                }
                writeLZ77data(&local_1e8,(uivector *)&local_88,&tree_ll,&tree_d);
                uivector_cleanup(&local_88);
                puVar9 = tree_ll.codes;
                puVar10 = tree_ll.lengths;
              }
              writeBitsReversed(&local_1e8,puVar9[0x100],(ulong)puVar10[0x100]);
              uVar5 = 0;
            }
LAB_00124bb9:
            HuffmanTree_cleanup(&tree_ll);
            HuffmanTree_cleanup(&tree_d);
            uVar13 = local_198;
            puVar15 = local_1d0;
            uVar8 = local_180;
            settings = local_1d8;
            uVar19 = local_1c8;
          }
        }
        uVar8 = uVar8 + 1;
        puVar15 = puVar15 + uVar13;
        lVar7 = lVar7 + uVar13;
      }
    }
    free(__ptr);
    free(__ptr_00);
    free(local_178);
    free(__ptr_01);
    free(local_188);
    free(local_190);
    outsize = local_1a0;
    out = local_1a8;
  }
  else {
    uVar5 = 0x3d;
  }
LAB_0012546a:
  *out = v.data;
  *outsize = v.size;
  return uVar5;
}

Assistant:

unsigned lodepng_deflate(unsigned char** out, size_t* outsize,
  const unsigned char* in, size_t insize,
  const LodePNGCompressSettings* settings) {
  ucvector v = ucvector_init(*out, *outsize);
  unsigned error = lodepng_deflatev(&v, in, insize, settings);
  *out = v.data;
  *outsize = v.size;
  return error;
}